

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall CVmObjStringBuffer::ensure_space(CVmObjStringBuffer *this,int32_t len)

{
  vm_strbuf_ext *pvVar1;
  int in_ESI;
  CVmObjStringBuffer *in_RDI;
  int32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (0x7fffffff < in_ESI) {
    err_throw(0);
  }
  pvVar1 = get_ext(in_RDI);
  if (pvVar1->alo < in_ESI) {
    get_ext(in_RDI);
    pvVar1 = vm_strbuf_ext::expand_ext
                       (in_RDI,(vm_strbuf_ext *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    (in_RDI->super_CVmObject).ext_ = (char *)pvVar1;
  }
  return;
}

Assistant:

void CVmObjStringBuffer::ensure_space(VMG_ int32_t len)
{
    /* if the desired new length exceeds the limit, it's an error */
    if (len > STRBUF_MAX_LEN)
        err_throw(VMERR_STR_TOO_LONG);

    /* if the desired new length exceeds the current allocation, expand it */
    if (len > (int32_t)get_ext()->alo)
    {
        ext_ = (char *)vm_strbuf_ext::expand_ext(
            vmg_ this, get_ext(), len);
    }
}